

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O3

uint __thiscall FormatTypeRAW::ComputeTrack(FormatTypeRAW *this,int index,Revolution *revolution)

{
  uint uVar1;
  pointer paVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Revolution *pRVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  
  lVar9 = (long)index;
  paVar2 = (this->index_list_).
           super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = this->nb_flux_value_;
  uVar10 = (ulong)uVar8;
  if (uVar10 == 0) {
    uVar15 = 0;
LAB_0015f720:
    uVar7 = (uint)uVar15;
    if (uVar7 < uVar8) {
      uVar15 = uVar15 & 0xffffffff;
      do {
        uVar17 = uVar15;
        if (this->flux_list_[uVar15].stream_position == paVar2[lVar9 + 1].stream_position) break;
        uVar15 = uVar15 + 1;
        uVar17 = uVar10;
      } while (uVar8 != (uint)uVar15);
    }
    else {
      uVar17 = uVar15 & 0xffffffff;
    }
  }
  else {
    uVar15 = 0;
    do {
      if (paVar2[lVar9].stream_position <= this->flux_list_[uVar15].stream_position)
      goto LAB_0015f720;
      uVar15 = uVar15 + 1;
      uVar17 = uVar10;
      uVar7 = uVar8;
    } while (uVar10 != uVar15);
  }
  uVar13 = 0;
  uVar8 = 0;
  iVar12 = 0;
  if (uVar7 != 0) {
    uVar8 = this->flux_list_[uVar7 - 1].flux_value;
    iVar12 = uVar8 - paVar2[lVar9].flux_value;
    if (uVar8 < paVar2[lVar9].flux_value || iVar12 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (uint)(iVar12 * 0xa293) / 1000;
      iVar12 = 0;
    }
  }
  uVar16 = (uint)uVar17;
  if (uVar7 < uVar16) {
    uVar1 = paVar2[lVar9 + 1].flux_value;
    pRVar14 = revolution + lVar9;
    uVar6 = 2000;
    iVar11 = 0;
    uVar13 = 0;
    iVar19 = 0;
    uVar20 = uVar7;
    do {
      if ((int)uVar8 < (int)(uVar6 >> 1)) {
        uVar18 = this->flux_list_[uVar20].flux_value;
        if (uVar20 == uVar7) {
          uVar18 = uVar18 + iVar12;
        }
        else if (uVar20 + 1 == uVar16) {
          iVar11 = (int)(((double)uVar1 * 41619.0) / 1000.0 - (double)(int)uVar6);
        }
        uVar8 = (uVar18 * 0xa293) / 1000 + uVar8;
        iVar19 = 0;
        uVar20 = uVar20 + 1;
      }
      uVar8 = uVar8 - uVar6;
      if ((int)uVar8 < (int)(uVar6 >> 1)) {
        if (revolution != (Revolution *)0x0) {
          pRVar14->bitfield[uVar13] = '\x01';
        }
        if (iVar19 - 1U < 3) {
          iVar4 = (int)uVar8 / (iVar19 + 1);
          iVar5 = iVar4 / 5 + (iVar4 >> 0x1f);
        }
        else {
          iVar4 = 2000 - uVar6;
          iVar5 = iVar4 / 0x14 + (iVar4 >> 0x1f);
        }
        uVar6 = (iVar5 - (iVar4 >> 0x1f)) + uVar6;
        if (0x897 < (int)uVar6) {
          uVar6 = 0x898;
        }
        if ((int)uVar6 < 0x709) {
          uVar6 = 0x708;
        }
        uVar8 = (int)uVar8 / 2;
      }
      else {
        if (revolution != (Revolution *)0x0) {
          pRVar14->bitfield[uVar13] = '\0';
        }
        iVar19 = iVar19 + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar20 < uVar16);
    uVar7 = uVar6 >> 1;
    if (((int)uVar7 <= (int)uVar8) && (0 < iVar11)) {
      iVar19 = uVar8 - uVar6;
      iVar12 = iVar11 - uVar6;
      do {
        if (revolution != (Revolution *)0x0) {
          pRVar14->bitfield[uVar13] = iVar19 < (int)uVar7;
        }
        uVar13 = uVar13 + 1;
        if (iVar19 < (int)uVar7) {
          return uVar13;
        }
        iVar19 = iVar19 - uVar6;
        bVar3 = 0 < iVar12;
        iVar12 = iVar12 - uVar6;
      } while (bVar3);
    }
  }
  return uVar13;
}

Assistant:

unsigned int FormatTypeRAW::ComputeTrack(int index, IDisk::Revolution* revolution)
{
#define CLOCK_MAX_ADJ 10
#define CLOCK_MIN(_c) (((_c) * (100 - CLOCK_MAX_ADJ)) / 100)
#define CLOCK_MAX(_c) (((_c) * (100 + CLOCK_MAX_ADJ)) / 100)

#define MCK_FREQ (((18432000 * 73) / 14) / 2)
#define SCK_FREQ (MCK_FREQ / 2)
#define ICK_FREQ (MCK_FREQ / 16)
#define SCK_PS_PER_TICK (1000000000/(SCK_FREQ/1000))
#define PERIOD_ADJ_PCT 5

   int flux = 0;
   int clock = 2000; // 2 us
   int clock_centre = clock;
   unsigned int i = 0;
   unsigned int nb_bit_in_flux = 0;
   int clocked_zeros = 0;

   IndexElement debut = index_list_[index];
   IndexElement fin = index_list_[index + 1];

   unsigned int j;
   double first_flux_value = 0, last_flux_value = 0;
   // Get next cell
   for (i = 0; i < nb_flux_value_; i++)
   {
      if (flux_list_[i].stream_position >= debut.stream_position)
      {
         break;
      }
   }
   for (j = i; j < nb_flux_value_; j++)
   {
      if (flux_list_[j].stream_position == fin.stream_position)
      {
         //last_flux_value = fin.flux_value; // m_FluxList[j].flux_value;
         //j --;
         break;
      }
   }
   nb_bit_in_flux = 0;

   // Get the proper first cell
   first_flux_value = debut.flux_value;
   last_flux_value = fin.flux_value;

   int remaining = 0;
   int remaining_negative = 0;
   // Value of the first cell :
   if (i > 0)
   {
      if (flux_list_[i - 1].flux_value > first_flux_value)
         remaining = flux_list_[i - 1].flux_value - static_cast<int>(first_flux_value);
      else
         remaining_negative = static_cast<int>(first_flux_value) - flux_list_[i - 1].flux_value;
   }

   // Adjust first / last, to avoid having a double bit


   // Cell first ??
   flux = (remaining * SCK_PS_PER_TICK) / 1000u;
   int end_flux = 0;
   //flux = remaining;

   unsigned int k = i;
   //i = 0;
   //while (i < sizeOfBuffer*2)
   for (; k < j;)
   {
      // What's the current flux status
      // Under a half clock : add the next one
      if (flux < clock / 2 && k < j)
      {
         int localflux = flux_list_[k++].flux_value;
         if (k - 1 == i)
         {
            localflux -= remaining_negative;
         }
         else if (k == j)
         {
            end_flux = static_cast<int>((last_flux_value * SCK_PS_PER_TICK) / 1000u - clock);
            // Compute last flux : It's xomputed to know WHEN to stop, not WHAT is it containing.

            /*
            if (last_flux_value < localflux)
            localflux = last_flux_value;
            else
            {
            // To check
            int dbg = 1;
            localflux = last_flux_value;
            }*/
         }

         flux += (localflux * SCK_PS_PER_TICK) / 1000u;
         clocked_zeros = 0;
      }

      // Remove a clock value to the flux
      flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // Otherwise, we have a one
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
         nb_bit_in_flux++;

         // PLL computations HERE !
         if ((clocked_zeros >= 1) && (clocked_zeros <= 3))
         {
            // In sync: adjust base clock by 10% of phase mismatch.
            int diff = flux / (int)(clocked_zeros + 1);
            clock += diff / PERIOD_ADJ_PCT;
         }
         else
         {
            clock += (clock_centre - clock) * PERIOD_ADJ_PCT / 100;
         }


         clock = max(CLOCK_MIN(clock_centre),
                     min(CLOCK_MAX(clock_centre), clock));

         flux = flux / 2;
      }
   }

   // End adjustement
   while (flux >= clock / 2 && end_flux > 0)
   {
      flux -= clock;
      end_flux -= clock;

      // If it remains at least a half clock : A zero's there
      if (flux >= clock / 2)
      {
         if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 0;
         clocked_zeros++;
         nb_bit_in_flux++;
      }
      else
      {
         // NOT ALWAYS : We have a ending one when the last flux reversal is smaller than the flux index
         // Otherwise, we have a one
         //if (last_flux_value > m_FluxList[j-1].flux_value )
         // This should be rethought and adjusted.... TODO
         //if (flux >= -(clock / 2))
         {
            // To check
            if (revolution != NULL) revolution[index].bitfield[nb_bit_in_flux] = 1;
            nb_bit_in_flux++;
         }
      }
   }

   return nb_bit_in_flux;
}